

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O2

TValue * luaH_newkey(lua_State *L,Table *t,TValue *key)

{
  uint uVar1;
  uint uVar2;
  Value VVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  int lg;
  uint uVar6;
  Node *pNVar7;
  Node *pNVar8;
  Node *pNVar9;
  long lVar10;
  long lVar11;
  TValue *pTVar12;
  int ttlg;
  uint uVar13;
  Node *pNVar14;
  ulong uVar15;
  int twotoi;
  ulong uVar16;
  int ause;
  int iVar17;
  uint uVar18;
  char *fmt;
  long lVar19;
  int iVar20;
  long lVar21;
  int iVar22;
  int *nums;
  Node *pNVar23;
  int iVar24;
  TValue *io2;
  bool bVar25;
  int local_cc;
  int local_b8 [34];
  
  if (key->tt_ == 3) {
    if (NAN((key->value_).n)) {
      fmt = "table index is NaN";
      goto LAB_0010f83b;
    }
  }
  else if (key->tt_ == 0) {
    fmt = "table index is nil";
LAB_0010f83b:
    luaG_runerror(L,fmt);
  }
  pNVar7 = mainposition(t,key);
  if ((pNVar7 == &dummynode_) || (pNVar23 = pNVar7, (pNVar7->i_val).tt_ != 0)) {
    pNVar23 = t->lastfree;
    while (pNVar14 = pNVar23, t->node < pNVar14) {
      pNVar23 = pNVar14 + -1;
      t->lastfree = pNVar23;
      if (pNVar14[-1].i_key.nk.tt_ == 0) goto code_r0x0010f619;
    }
    for (lVar10 = 0; lVar10 != 0x1f; lVar10 = lVar10 + 1) {
      local_b8[lVar10] = 0;
    }
    iVar24 = 1;
    iVar17 = 0;
    lVar10 = 1;
    for (lVar11 = 0; lVar11 != 0x1f; lVar11 = lVar11 + 1) {
      iVar22 = t->sizearray;
      iVar20 = iVar24;
      if ((iVar22 < iVar24) && (iVar20 = iVar22, iVar22 < (int)lVar10)) break;
      lVar19 = (long)(int)lVar10;
      lVar10 = (long)iVar20 + 1;
      if ((long)iVar20 + 1 <= lVar19) {
        lVar10 = lVar19;
      }
      lVar21 = lVar10 - lVar19;
      lVar19 = lVar19 * 0x10 + -8;
      iVar22 = 0;
      while (bVar25 = lVar21 != 0, lVar21 = lVar21 + -1, bVar25) {
        iVar22 = (iVar22 + 1) - (uint)(*(int *)((long)&t->array->value_ + lVar19) == 0);
        lVar19 = lVar19 + 0x10;
      }
      local_b8[lVar11] = local_b8[lVar11] + iVar22;
      iVar17 = iVar17 + iVar22;
      iVar24 = iVar24 * 2;
    }
    uVar16 = 1;
    lVar10 = (long)(1 << (t->lsizenode & 0x1f));
    iVar24 = 0;
    nums = local_b8;
    local_cc = 0;
    do {
      lVar11 = -lVar10;
      lVar10 = lVar10 * 0x28 + 0x10;
      do {
        lVar19 = lVar10;
        lVar11 = lVar11 + 1;
        if (lVar11 == 1) {
          iVar22 = countint(key,nums);
          uVar6 = iVar22 + iVar24 + iVar17;
          uVar18 = 0;
          uVar13 = 0;
          uVar15 = 0;
          goto LAB_0010f770;
        }
        lVar10 = lVar19 + -0x28;
      } while (*(int *)((long)t->node + lVar19 + -0x30) == 0);
      iVar22 = countint((TValue *)((long)&t->node[-1].i_val.value_ + lVar19),nums);
      iVar24 = iVar24 + iVar22;
      local_cc = local_cc + 1;
      lVar10 = -lVar11;
    } while( true );
  }
  goto LAB_0010f7ed;
LAB_0010f770:
  iVar24 = (int)uVar15;
  uVar2 = (uint)(uVar16 >> 1);
  if (uVar6 <= uVar2) {
LAB_0010f7a8:
    luaH_resize(L,t,iVar24,((iVar17 + local_cc) - uVar13) + 1);
    pTVar12 = luaH_set(L,t,key);
    return pTVar12;
  }
  iVar24 = *nums;
  uVar1 = iVar24 + uVar18;
  if (0 < iVar24) {
    uVar18 = uVar1;
  }
  if (0 < iVar24 && (int)uVar2 < (int)uVar1) {
    uVar15 = uVar16;
    uVar13 = uVar1;
  }
  iVar24 = (int)uVar15;
  if (uVar18 == uVar6) goto LAB_0010f7a8;
  uVar16 = (ulong)(uint)((int)uVar16 * 2);
  nums = nums + 1;
  goto LAB_0010f770;
code_r0x0010f619:
  pNVar8 = mainposition(t,&(pNVar7->i_key).tvk);
  if (pNVar8 == pNVar7) {
    pNVar14[-1].i_key.nk.next = (pNVar7->i_key).nk.next;
    (pNVar7->i_key).nk.next = pNVar23;
  }
  else {
    do {
      pNVar9 = pNVar8;
      pNVar8 = (pNVar9->i_key).nk.next;
    } while (pNVar8 != pNVar7);
    (pNVar9->i_key).nk.next = pNVar23;
    pNVar14[-1].i_key.nk.next = (pNVar7->i_key).nk.next;
    VVar3 = (pNVar7->i_val).value_;
    iVar24 = (pNVar7->i_val).tt_;
    uVar5 = *(undefined4 *)&(pNVar7->i_val).field_0xc;
    uVar4 = *(undefined8 *)((long)&pNVar7->i_key + 8);
    pNVar14[-1].i_key.nk.value_ = (pNVar7->i_key).nk.value_;
    *(undefined8 *)((long)&pNVar14[-1].i_key + 8) = uVar4;
    (pNVar23->i_val).value_ = VVar3;
    pNVar14[-1].i_val.tt_ = iVar24;
    *(undefined4 *)&pNVar14[-1].i_val.field_0xc = uVar5;
    (pNVar7->i_key).nk.next = (Node *)0x0;
    (pNVar7->i_val).tt_ = 0;
    pNVar23 = pNVar7;
  }
LAB_0010f7ed:
  (pNVar23->i_key).nk.value_ = key->value_;
  uVar18 = key->tt_;
  (pNVar23->i_key).nk.tt_ = uVar18;
  if ((((uVar18 & 0x40) != 0) && (((byte)(key->value_).f[9] & 3) != 0)) && ((t->marked & 4) != 0)) {
    luaC_barrierback_(L,(GCObject *)t);
  }
  return &pNVar23->i_val;
}

Assistant:

TValue *luaH_newkey (lua_State *L, Table *t, const TValue *key) {
  Node *mp;
  if (ttisnil(key)) luaG_runerror(L, "table index is nil");
  else if (ttisnumber(key) && luai_numisnan(L, nvalue(key)))
    luaG_runerror(L, "table index is NaN");
  mp = mainposition(t, key);
  if (!ttisnil(gval(mp)) || isdummy(mp)) {  /* main position is taken? */
    Node *othern;
    Node *n = getfreepos(t);  /* get a free place */
    if (n == NULL) {  /* cannot find a free place? */
      rehash(L, t, key);  /* grow table */
      /* whatever called 'newkey' take care of TM cache and GC barrier */
      return luaH_set(L, t, key);  /* insert key into grown table */
    }
    lua_assert(!isdummy(n));
    othern = mainposition(t, gkey(mp));
    if (othern != mp) {  /* is colliding node out of its main position? */
      /* yes; move colliding node into free position */
      while (gnext(othern) != mp) othern = gnext(othern);  /* find previous */
      gnext(othern) = n;  /* redo the chain with `n' in place of `mp' */
      *n = *mp;  /* copy colliding node into free pos. (mp->next also goes) */
      gnext(mp) = NULL;  /* now `mp' is free */
      setnilvalue(gval(mp));
    }
    else {  /* colliding node is in its own main position */
      /* new node will go into free position */
      gnext(n) = gnext(mp);  /* chain new position */
      gnext(mp) = n;
      mp = n;
    }
  }
  setobj2t(L, gkey(mp), key);
  luaC_barrierback(L, obj2gco(t), key);
  lua_assert(ttisnil(gval(mp)));
  return gval(mp);
}